

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

wchar_t archive_read_format_lha_bid(archive_read *a,wchar_t best_bid)

{
  void *h;
  long in_RAX;
  char *h_00;
  size_t sVar1;
  void *pvVar2;
  ulong uVar3;
  wchar_t wVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  ssize_t bytes_avail;
  long local_38;
  
  wVar4 = L'\xffffffff';
  if ((best_bid < L'\x1f') &&
     (local_38 = in_RAX, h_00 = (char *)__archive_read_ahead(a,0x16,(ssize_t *)0x0),
     h_00 != (char *)0x0)) {
    sVar1 = lha_check_header_format(h_00);
    if (sVar1 == 0) {
LAB_004002d1:
      wVar4 = L'\x1e';
    }
    else {
      wVar4 = L'\0';
      if ((*h_00 == 'M') && (wVar4 = L'\0', h_00[1] == 'Z')) {
        lVar7 = 0;
        uVar6 = 0x1000;
        do {
          while (pvVar2 = __archive_read_ahead(a,lVar7 + uVar6,&local_38), pvVar2 != (void *)0x0) {
            uVar5 = local_38 + (long)pvVar2;
            uVar3 = (long)pvVar2 + lVar7 + 0x16;
            h = (void *)((long)pvVar2 + lVar7);
            while (uVar3 < uVar5) {
              sVar1 = lha_check_header_format(h);
              if (sVar1 == 0) goto LAB_004002d1;
              uVar3 = (long)h + sVar1 + 0x16;
              h = (void *)((long)h + sVar1);
            }
            lVar7 = (long)h - (long)pvVar2;
            if (0x4fff < lVar7) {
              return L'\0';
            }
          }
          bVar8 = 0x31 < uVar6;
          uVar6 = uVar6 >> 1;
        } while (bVar8);
        wVar4 = L'\0';
      }
    }
  }
  return wVar4;
}

Assistant:

static int
archive_read_format_lha_bid(struct archive_read *a, int best_bid)
{
	const char *p;
	const void *buff;
	ssize_t bytes_avail, offset, window;
	size_t next;

	/* If there's already a better bid than we can ever
	   make, don't bother testing. */
	if (best_bid > 30)
		return (-1);

	if ((p = __archive_read_ahead(a, H_SIZE, NULL)) == NULL)
		return (-1);

	if (lha_check_header_format(p) == 0)
		return (30);

	if (p[0] == 'M' && p[1] == 'Z') {
		/* PE file */
		offset = 0;
		window = 4096;
		while (offset < (1024 * 20)) {
			buff = __archive_read_ahead(a, offset + window,
			    &bytes_avail);
			if (buff == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < (H_SIZE + 3))
					return (0);
				continue;
			}
			p = (const char *)buff + offset;
			while (p + H_SIZE < (const char *)buff + bytes_avail) {
				if ((next = lha_check_header_format(p)) == 0)
					return (30);
				p += next;
			}
			offset = p - (const char *)buff;
		}
	}
	return (0);
}